

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

decimal_fp<double> fmt::v7::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  carrier_uint cVar9;
  decimal_fp<double> dVar10;
  bool approx_y_parity;
  uint32_t dist;
  uint32_t mask;
  carrier_uint two_fl;
  uint32_t r;
  carrier_uint zi;
  carrier_uint two_fr;
  carrier_uint two_fc;
  uint32_t deltai;
  int beta_minus_1;
  cache_entry_type cache;
  int minus_k;
  bool include_right_endpoint;
  bool include_left_endpoint;
  int exponent;
  carrier_uint significand;
  carrier_uint significand_mask;
  unsigned_long br;
  decimal_fp<double> ret_value;
  carrier_uint zi_1;
  carrier_uint xi;
  cache_entry_type cache_1;
  int beta_minus_1_1;
  int minus_k_1;
  decimal_fp<double> ret_value_1;
  uint32_t remainder;
  uint32_t quotient;
  int s;
  uint32_t quotient_1;
  uint64_t quotient_candidate;
  uint64_t max_quotient8;
  uint64_t mod_inv8;
  uint32_t max_quotient1;
  uint32_t mod_inv1;
  int t;
  uint32_t remainder_1;
  uint32_t quotient_2;
  int s_1;
  uint32_t quotient_3;
  uint64_t quotient_candidate_1;
  uint64_t max_quotient8_1;
  uint64_t mod_inv8_1;
  uint32_t max_quotient1_1;
  uint32_t mod_inv1_1;
  int t_1;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  cache_entry_type *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  carrier_uint in_stack_fffffffffffffe80;
  uint local_160 [2];
  long local_158;
  uint local_14c;
  carrier_uint local_148;
  ulong local_140;
  ulong local_138;
  uint32_t local_130;
  int local_12c;
  uint128_wrapper *local_128;
  int local_114;
  byte local_10e;
  byte local_10d;
  int local_10c;
  int iVar11;
  double local_f0;
  ulong local_e8;
  int local_e0;
  ulong local_d8;
  carrier_uint local_d0;
  uint128_wrapper *local_c8;
  int local_ac;
  int local_a8;
  int local_a4;
  ulong local_a0;
  int local_98;
  int local_88;
  uint local_84;
  int local_5c;
  int local_4c;
  int local_40;
  uint local_3c;
  int local_14;
  int local_4;
  
  uVar7 = bit_cast<unsigned_long,double>(&local_f0);
  uVar8 = uVar7 & 0xfffffffffffff;
  cVar9 = exponent_mask<double>();
  uVar5 = ((uint)(uVar7 >> 0x20) & (uint)(cVar9 >> 0x20)) >> 0x14;
  if (uVar5 == 0) {
    if (uVar8 == 0) {
      local_e8 = 0;
      local_e0 = 0;
      goto LAB_00143620;
    }
    local_10c = -0x432;
  }
  else {
    local_10c = uVar5 - 0x433;
    if (uVar8 == 0) {
      local_a4 = local_10c;
      local_a8 = floor_log10_pow2_minus_log10_4_over_3(local_10c);
      iVar4 = local_a4;
      iVar11 = (int)(uVar8 >> 0x20);
      local_ac = floor_log2_pow10(-local_a8);
      local_ac = iVar4 + local_ac;
      local_c8 = cache_accessor<double>::get_cached_power(iVar11);
      local_d0 = cache_accessor<double>::compute_left_endpoint_for_shorter_interval_case
                           (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      local_d8 = cache_accessor<double>::compute_right_endpoint_for_shorter_interval_case
                           (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      bVar3 = is_left_endpoint_integer_shorter_interval<double>(local_a4);
      if (!bVar3) {
        local_d0 = local_d0 + 1;
      }
      local_a0 = local_d8 / 10;
      if (local_a0 * 10 < local_d0) {
        local_a0 = cache_accessor<double>::compute_round_up_for_shorter_interval_case
                             (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        local_98 = local_a8;
        if ((local_a4 < -0x4d) || (-0x4d < local_a4)) {
          if (local_a0 < local_d0) {
            local_a0 = local_a0 + 1;
          }
        }
        else if ((local_a0 & 1) != 0) {
          local_a0 = local_a0 - 1;
        }
      }
      else {
        local_5c = 0;
        for (uVar8 = local_a0; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
          local_5c = local_5c + 1;
        }
        if (0x10 < local_5c) {
          local_5c = 0x10;
        }
        if ((local_5c < 8) || (0x2af31dc46118 < local_a0 * -0x3898f8b4dd16f1df)) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_a0;
          uVar5 = SUB164(auVar1 / ZEXT816(100000000),0);
          iVar4 = (int)local_a0 + uVar5 * -100000000;
          if ((local_5c == 0) || (0x33333333 < (uint)(iVar4 * -0x33333333))) {
            local_4c = 0;
          }
          else if ((local_5c == 1) || (0x33333333 < (uint)(iVar4 * -0x3d70a3d7))) {
            local_a0 = (ulong)((uint)(iVar4 * -0x33333333) >> 1) + (ulong)uVar5 * 10000000;
            local_4c = 1;
          }
          else if ((local_5c == 2) || (0x33333333 < (uint)(iVar4 * 0x26e978d5))) {
            local_a0 = (ulong)((uint)(iVar4 * -0x3d70a3d7) >> 2) + (ulong)uVar5 * 1000000;
            local_4c = 2;
          }
          else if ((local_5c == 3) || (0x33333333 < (uint)(iVar4 * 0x3afb7e91))) {
            local_a0 = (ulong)((uint)(iVar4 * 0x26e978d5) >> 3) + (ulong)uVar5 * 100000;
            local_4c = 3;
          }
          else if ((local_5c == 4) || (0x33333333 < (uint)(iVar4 * 0xbcbe61d))) {
            local_a0 = (ulong)((uint)(iVar4 * 0x3afb7e91) >> 4) + (ulong)uVar5 * 10000;
            local_4c = 4;
          }
          else if ((local_5c == 5) || (0x33333333 < (uint)(iVar4 * 0x68c26139))) {
            local_a0 = (ulong)((uint)(iVar4 * 0xbcbe61d) >> 5) + (ulong)uVar5 * 1000;
            local_4c = 5;
          }
          else if ((local_5c == 6) || (0x33333333 < (uint)(iVar4 * -0x5172b95b))) {
            local_a0 = (ulong)((uint)(iVar4 * 0x68c26139) >> 6) + (ulong)uVar5 * 100;
            local_4c = 6;
          }
          else {
            local_a0 = (ulong)((uint)(iVar4 * -0x5172b95b) >> 7) + (ulong)uVar5 * 10;
            local_4c = 7;
          }
        }
        else {
          local_88 = 8;
          for (local_84 = (uint)(local_a0 * -0x3898f8b4dd16f1df >> 8);
              (local_88 < local_5c && (local_84 * -0x33333333 < 0x33333334));
              local_84 = local_84 * -0x33333333) {
            local_88 = local_88 + 1;
          }
          local_a0 = (ulong)(local_84 >> ((char)local_88 - 8U & 0x1f));
          local_4c = local_88;
        }
        local_98 = local_4c + local_a8 + 1;
      }
      local_e8 = local_a0;
      local_e0 = local_98;
      goto LAB_00143620;
    }
    uVar8 = uVar8 | 0x10000000000000;
  }
  local_10e = (uVar8 & 1) == 0;
  local_10d = local_10e;
  local_114 = floor_log10_pow2(local_10c);
  local_114 = local_114 + -2;
  local_128 = cache_accessor<double>::get_cached_power((int)(uVar8 >> 0x20));
  iVar4 = local_10c;
  local_12c = floor_log2_pow10(-local_114);
  local_12c = iVar4 + local_12c;
  local_130 = cache_accessor<double>::compute_delta
                        (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  iVar11 = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_138 = uVar8 << 1;
  local_140 = local_138 | 1;
  local_148 = cache_accessor<double>::compute_mul
                        (in_stack_fffffffffffffe80,
                         (cache_entry_type *)CONCAT44(iVar4,in_stack_fffffffffffffe78));
  local_e8 = divide_by_10_to_kappa_plus_1(0x142f33);
  local_14c = (int)local_148 + (int)local_e8 * -1000;
  if (local_130 < local_14c) {
LAB_001434bb:
    local_e8 = local_e8 * 10;
    local_e0 = local_114 + 2;
    local_160[1] = 3;
    local_160[0] = (local_14c - (local_130 >> 1)) + 0x32;
    if ((local_160[0] & 3) == 0) {
      uVar5 = local_160[0] & 1;
      local_160[0] = local_160[0] >> 2;
      bVar3 = check_divisibility_and_divide_by_pow5<2>(local_160);
      if (bVar3) {
        local_e8 = local_160[0] + local_e8;
        bVar3 = cache_accessor<double>::compute_mul_parity
                          (in_stack_fffffffffffffe80,
                           (cache_entry_type *)CONCAT44(iVar4,in_stack_fffffffffffffe78),iVar11);
        if (bVar3 == (uVar5 != 0)) {
          bVar3 = is_center_integer<double>
                            (CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0,
                             0x1435a4);
          if ((bVar3) && ((local_e8 & 1) != 0)) {
            local_e8 = local_e8 - 1;
          }
        }
        else {
          local_e8 = local_e8 - 1;
        }
      }
      else {
        local_e8 = local_160[0] + local_e8;
      }
    }
    else {
      uVar6 = small_division_by_pow10<2>(local_160[0]);
      local_e8 = uVar6 + local_e8;
    }
  }
  else {
    if (local_14c < local_130) {
      if (((local_14c == 0) && ((local_10e & 1) == 0)) &&
         (bVar3 = is_endpoint_integer<double>
                            (CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0,
                             0x142f95), bVar3)) {
        local_e8 = local_e8 - 1;
        local_14c = 1000;
        goto LAB_001434bb;
      }
    }
    else {
      local_158 = local_138 - 1;
      if ((((local_10d & 1) == 0) ||
          (bVar3 = is_endpoint_integer<double>
                             (CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0,
                              0x142fee), !bVar3)) &&
         (bVar3 = cache_accessor<double>::compute_mul_parity
                            (in_stack_fffffffffffffe80,
                             (cache_entry_type *)CONCAT44(iVar4,in_stack_fffffffffffffe78),iVar11),
         !bVar3)) goto LAB_001434bb;
    }
    local_14 = 0;
    for (uVar8 = local_e8; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
      local_14 = local_14 + 1;
    }
    if (0x10 < local_14) {
      local_14 = 0x10;
    }
    if ((local_14 < 8) || (0x2af31dc46118 < local_e8 * -0x3898f8b4dd16f1df)) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_e8;
      uVar5 = SUB164(auVar2 / ZEXT816(100000000),0);
      iVar4 = (int)local_e8 + uVar5 * -100000000;
      if ((local_14 == 0) || (0x33333333 < (uint)(iVar4 * -0x33333333))) {
        local_4 = 0;
      }
      else if ((local_14 == 1) || (0x33333333 < (uint)(iVar4 * -0x3d70a3d7))) {
        local_e8 = (ulong)((uint)(iVar4 * -0x33333333) >> 1) + (ulong)uVar5 * 10000000;
        local_4 = 1;
      }
      else if ((local_14 == 2) || (0x33333333 < (uint)(iVar4 * 0x26e978d5))) {
        local_e8 = (ulong)((uint)(iVar4 * -0x3d70a3d7) >> 2) + (ulong)uVar5 * 1000000;
        local_4 = 2;
      }
      else if ((local_14 == 3) || (0x33333333 < (uint)(iVar4 * 0x3afb7e91))) {
        local_e8 = (ulong)((uint)(iVar4 * 0x26e978d5) >> 3) + (ulong)uVar5 * 100000;
        local_4 = 3;
      }
      else if ((local_14 == 4) || (0x33333333 < (uint)(iVar4 * 0xbcbe61d))) {
        local_e8 = (ulong)((uint)(iVar4 * 0x3afb7e91) >> 4) + (ulong)uVar5 * 10000;
        local_4 = 4;
      }
      else if ((local_14 == 5) || (0x33333333 < (uint)(iVar4 * 0x68c26139))) {
        local_e8 = (ulong)((uint)(iVar4 * 0xbcbe61d) >> 5) + (ulong)uVar5 * 1000;
        local_4 = 5;
      }
      else if ((local_14 == 6) || (0x33333333 < (uint)(iVar4 * -0x5172b95b))) {
        local_e8 = (ulong)((uint)(iVar4 * 0x68c26139) >> 6) + (ulong)uVar5 * 100;
        local_4 = 6;
      }
      else {
        local_e8 = (ulong)((uint)(iVar4 * -0x5172b95b) >> 7) + (ulong)uVar5 * 10;
        local_4 = 7;
      }
    }
    else {
      local_40 = 8;
      for (local_3c = (uint)(local_e8 * -0x3898f8b4dd16f1df >> 8);
          (local_40 < local_14 && (local_3c * -0x33333333 < 0x33333334));
          local_3c = local_3c * -0x33333333) {
        local_40 = local_40 + 1;
      }
      local_e8 = (ulong)(local_3c >> ((char)local_40 - 8U & 0x1f));
      local_4 = local_40;
    }
    local_e0 = local_4 + local_114 + 3;
  }
LAB_00143620:
  dVar10.exponent = local_e0;
  dVar10.significand = local_e8;
  dVar10._12_4_ = 0;
  return dVar10;
}

Assistant:

FMT_SAFEBUFFERS decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}